

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minesweeper.cpp
# Opt level: O0

void __thiscall
MinefieldGeneratorTests::TestExpectedGridIsProduced
          (MinefieldGeneratorTests *this,uint8_t w,uint8_t h,string *input,string *expected)

{
  ostream *poVar1;
  anon_class_8_1_8991fb9c local_2a0;
  function<void_()> local_298;
  allocator local_271;
  string local_270 [32];
  anon_class_80_5_0dda5dc8 local_250;
  function<void_()> local_200;
  string local_1e0 [48];
  stringstream local_1b0 [8];
  stringstream whenDescription;
  ostream local_1a0 [376];
  string *local_28;
  string *expected_local;
  string *input_local;
  uint8_t h_local;
  MinefieldGeneratorTests *pMStack_10;
  uint8_t w_local;
  MinefieldGeneratorTests *this_local;
  
  local_28 = expected;
  expected_local = input;
  input_local._6_1_ = h;
  input_local._7_1_ = w;
  pMStack_10 = this;
  std::__cxx11::string::operator=((string *)&this->m_expectedGrid,(string *)expected);
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar1 = std::operator<<(local_1a0,"generating a field with width ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)input_local._7_1_);
  poVar1 = std::operator<<(poVar1," and height ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)input_local._6_1_);
  poVar1 = std::operator<<(poVar1," and input of ");
  std::operator<<(poVar1,(string *)input);
  std::__cxx11::stringstream::str();
  local_250.w = input_local._7_1_;
  local_250.h = input_local._6_1_;
  std::__cxx11::string::string((string *)&local_250.input,(string *)input);
  std::__cxx11::string::string((string *)&local_250.expected,(string *)expected);
  local_250.this = this;
  std::function<void()>::
  function<MinefieldGeneratorTests::TestExpectedGridIsProduced(unsigned_char,unsigned_char,std::__cxx11::string,std::__cxx11::string)::_lambda()_1_,void>
            ((function<void()> *)&local_200,&local_250);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[5])
            (this,local_1e0,&local_200);
  std::function<void_()>::~function(&local_200);
  TestExpectedGridIsProduced(unsigned_char,unsigned_char,std::__cxx11::string,std::__cxx11::string)
  ::{lambda()#1}::~basic_string((_lambda___1_ *)&local_250);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"the expected result was returned",&local_271);
  local_2a0.this = this;
  std::function<void()>::
  function<MinefieldGeneratorTests::TestExpectedGridIsProduced(unsigned_char,unsigned_char,std::__cxx11::string,std::__cxx11::string)::_lambda()_2_,void>
            ((function<void()> *)&local_298,&local_2a0);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_270,&local_298);
  std::function<void_()>::~function(&local_298);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return;
}

Assistant:

void TestExpectedGridIsProduced(uint8_t w, uint8_t h, std::string input, std::string expected)
	{
		m_expectedGrid = expected;

		std::stringstream whenDescription;
		whenDescription << "generating a field with width " << (int)w << " and height " << (int)h << " and input of " << input;
		When(whenDescription.str(), [&, w, h, input, expected]() {
			m_expectedGrid = expected;

			minesweeper::MinefieldGenerator generator(w,h);
			m_returnedGrid = generator.GenerateMinefield(input);
		});

		Then("the expected result was returned", [&](){
			AssertThat(m_returnedGrid, ut11::Is::EqualTo(m_expectedGrid));
		});
	}